

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_statemach_act(connectdata *conn)

{
  uint *puVar1;
  byte *pbVar2;
  curl_off_t *pcVar3;
  curl_usessl cVar4;
  void *pvVar5;
  pingpong *ppVar6;
  ulong uVar7;
  imapstate iVar8;
  long lVar9;
  pingpong *ppVar10;
  pingpong *ppVar11;
  _Bool _Var12;
  CURLcode CVar13;
  int iVar14;
  size_t sVar15;
  ulong uVar16;
  pingpong *size;
  size_t sVar17;
  pingpong *pp;
  char *__nptr;
  SessionHandle *pSVar18;
  char *pcVar19;
  ulong uStackY_90;
  char *chlg64;
  char *mech;
  size_t len;
  pingpong *local_58;
  imapstate local_4c;
  imapstate state1;
  curl_socket_t local_40;
  int imapcode;
  size_t nread;
  
  local_40 = conn->sock[0];
  nread = 0;
  CVar13 = CURLE_NOT_BUILT_IN;
  if ((conn->proto).imapc.state != IMAP_UPGRADETLS) {
    pp = (pingpong *)&conn->proto;
    if ((conn->proto).ftpc.pp.sendleft != 0) {
      CVar13 = Curl_pp_flushsend(pp);
      return CVar13;
    }
    uVar7 = 7;
    do {
      CVar13 = Curl_pp_readresp(local_40,pp,&imapcode,&nread);
      if (CVar13 != CURLE_OK) {
        return CVar13;
      }
      if (imapcode == -1) {
        return CURLE_FTP_WEIRD_SERVER_REPLY;
      }
      if (imapcode == 0) {
        return CURLE_OK;
      }
      switch((conn->proto).imapc.state) {
      case IMAP_SERVERGREET:
        if (imapcode != 0x4f) {
          Curl_failf(conn->data,"Got unexpected imap-server response");
          return CURLE_FTP_WEIRD_SERVER_REPLY;
        }
        (conn->proto).imapc.authmechs = 0;
        (conn->proto).ftpc.diralloc = 0;
        (conn->proto).ftpc.ctl_valid = false;
        CVar13 = imap_sendf(conn,"CAPABILITY");
        iVar8 = IMAP_CAPABILITY;
        goto LAB_0044656d;
      case IMAP_CAPABILITY:
        pSVar18 = conn->data;
        if (imapcode == 0x4f) {
          cVar4 = (pSVar18->set).use_ssl;
          if ((cVar4 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
            if ((conn->proto).ftpc.ctl_valid == true) {
              CVar13 = imap_sendf(conn,"STARTTLS");
              iVar8 = IMAP_STARTTLS;
              goto LAB_0044656d;
            }
            if (cVar4 != CURLUSESSL_TRY) {
              Curl_failf(pSVar18,"STARTTLS not supported.");
              return CURLE_USE_SSL_FAILED;
            }
          }
        }
        else if (imapcode == 0x2a) {
          pcVar19 = (pSVar18->state).buffer + 2;
LAB_004465a9:
          do {
            uVar16 = (ulong)(byte)*pcVar19;
            if (uVar16 < 0x21) {
              if ((0x100002600U >> (uVar16 & 0x3f) & 1) != 0) {
                pcVar19 = pcVar19 + 1;
                goto LAB_004465a9;
              }
              if (uVar16 == 0) goto LAB_00446d3f;
            }
            uStackY_90 = 0;
            while ((0x20 < (byte)uVar16 || ((0x100002601U >> (uVar16 & 0x3f) & 1) == 0))) {
              lVar9 = uStackY_90 + 1;
              uStackY_90 = uStackY_90 + 1;
              uVar16 = (ulong)(byte)pcVar19[lVar9];
            }
            if (uStackY_90 == 7) {
              iVar14 = bcmp(pcVar19,"SASL-IR",7);
              if (iVar14 != 0) goto LAB_00446677;
              (conn->proto).ftpc.cwdfail = true;
              uStackY_90 = uVar7;
            }
            else if (uStackY_90 == 0xd) {
              iVar14 = bcmp(pcVar19,"LOGINDISABLED",0xd);
              if (iVar14 != 0) goto LAB_00446677;
              (conn->proto).ftpc.cwddone = true;
              uStackY_90 = 0xd;
            }
            else if (uStackY_90 == 8) {
              if (*(long *)pcVar19 == 0x534c545452415453) {
                (conn->proto).ftpc.ctl_valid = true;
                uStackY_90 = 8;
              }
              else {
LAB_00446677:
                iVar14 = bcmp(pcVar19,"AUTH=",5);
                uVar16 = uStackY_90;
                if (iVar14 == 0) {
                  pcVar19 = pcVar19 + 5;
                  uVar16 = uStackY_90 - 5;
                  switch(uStackY_90) {
                  case 9:
                    if (*(int *)pcVar19 == 0x4d4c544e) {
                      pbVar2 = (byte *)((long)&conn->proto + 0x78);
                      *pbVar2 = *pbVar2 | 0x40;
                    }
                    uStackY_90 = 4;
                    break;
                  case 10:
                    iVar14 = bcmp(pcVar19,"LOGIN",5);
                    if (iVar14 == 0) {
                      pbVar2 = (byte *)((long)&conn->proto + 0x78);
                      *pbVar2 = *pbVar2 | 1;
                      uStackY_90 = 5;
                    }
                    else {
                      uStackY_90 = 5;
                      iVar14 = bcmp(pcVar19,"PLAIN",5);
                      if (iVar14 == 0) {
                        pbVar2 = (byte *)((long)&conn->proto + 0x78);
                        *pbVar2 = *pbVar2 | 2;
                      }
                    }
                    break;
                  case 0xb:
                    iVar14 = bcmp(pcVar19,"GSSAPI",6);
                    uStackY_90 = 6;
                    if (iVar14 == 0) {
                      pbVar2 = (byte *)((long)&conn->proto + 0x78);
                      *pbVar2 = *pbVar2 | 0x10;
                    }
                    break;
                  case 0xc:
                    iVar14 = bcmp(pcVar19,"XOAUTH2",7);
                    uStackY_90 = uVar7;
                    if (iVar14 == 0) {
                      pbVar2 = (byte *)((long)&conn->proto + 0x78);
                      *pbVar2 = *pbVar2 | 0x80;
                    }
                    break;
                  case 0xd:
                    if (*(long *)pcVar19 == 0x35444d2d4d415243) {
                      pbVar2 = (byte *)((long)&conn->proto + 0x78);
                      *pbVar2 = *pbVar2 | 4;
                    }
                    else if (*(long *)pcVar19 == 0x4c414e5245545845) {
                      pbVar2 = (byte *)((long)&conn->proto + 0x78);
                      *pbVar2 = *pbVar2 | 0x20;
                    }
                    uStackY_90 = 8;
                    break;
                  default:
                    goto switchD_004466b6_caseD_e;
                  case 0xf:
                    iVar14 = bcmp(pcVar19,"DIGEST-MD5",10);
                    if (iVar14 == 0) {
                      pbVar2 = (byte *)((long)&conn->proto + 0x78);
                      *pbVar2 = *pbVar2 | 8;
                    }
                    uStackY_90 = 10;
                  }
                }
                else {
switchD_004466b6_caseD_e:
                  uStackY_90 = uVar16;
                }
              }
            }
            else if (5 < uStackY_90) goto LAB_00446677;
            pcVar19 = pcVar19 + uStackY_90;
          } while( true );
        }
        goto LAB_00446d1b;
      case IMAP_STARTTLS:
        if (imapcode == 0x4f) {
          return CURLE_NOT_BUILT_IN;
        }
        if ((conn->data->set).use_ssl != CURLUSESSL_TRY) {
          Curl_failf(conn->data,"STARTTLS denied. %c",(ulong)(uint)imapcode);
          return CURLE_USE_SSL_FAILED;
        }
LAB_00446d1b:
        CVar13 = imap_perform_authentication(conn);
        break;
      default:
        goto switchD_004463a4_caseD_4;
      case IMAP_AUTHENTICATE_PLAIN:
        pSVar18 = conn->data;
        mech = (char *)0x0;
        chlg64 = (char *)0x0;
        if (imapcode == 0x2b) {
          CVar13 = Curl_sasl_create_plain_message
                             (pSVar18,conn->user,conn->passwd,&chlg64,(size_t *)&mech);
          goto LAB_00446902;
        }
        pcVar19 = "Access denied. %c";
LAB_00446ab7:
        mech = (char *)0x0;
        chlg64 = (char *)0x0;
        Curl_failf(pSVar18,pcVar19,(ulong)(uint)imapcode);
        CVar13 = CURLE_LOGIN_DENIED;
        goto LAB_00446acc;
      case IMAP_AUTHENTICATE_LOGIN:
        pSVar18 = conn->data;
        mech = (char *)0x0;
        chlg64 = (char *)0x0;
        if (imapcode != 0x2b) {
LAB_0044694e:
          pcVar19 = "Access denied: %d";
          goto LAB_00446ab7;
        }
        CVar13 = Curl_sasl_create_login_message(pSVar18,conn->user,&chlg64,(size_t *)&mech);
        if ((chlg64 == (char *)0x0 || CVar13 != CURLE_OK) ||
           (CVar13 = Curl_pp_sendf(pp,"%s"), CVar13 != CURLE_OK)) goto LAB_00446acc;
        (conn->proto).imapc.state = IMAP_AUTHENTICATE_LOGIN_PASSWD;
        goto LAB_00446946;
      case IMAP_AUTHENTICATE_LOGIN_PASSWD:
        pSVar18 = conn->data;
        mech = (char *)0x0;
        chlg64 = (char *)0x0;
        if (imapcode != 0x2b) goto LAB_0044694e;
        CVar13 = Curl_sasl_create_login_message(pSVar18,conn->passwd,&chlg64,(size_t *)&mech);
        goto LAB_00446902;
      case IMAP_AUTHENTICATE_CRAMMD5:
        pSVar18 = conn->data;
        mech = (char *)0x0;
        chlg64 = (char *)0x0;
        len = 0;
        _state1 = 0;
        if (imapcode == 0x2b) {
          imap_get_message((pSVar18->state).buffer,&chlg64);
          CVar13 = Curl_sasl_decode_cram_md5_message(chlg64,&mech,(size_t *)&state1);
          if (CVar13 == CURLE_OK) {
            CVar13 = Curl_sasl_create_cram_md5_message
                               (pSVar18,mech,conn->user,conn->passwd,(char **)&len,(size_t *)&state1
                               );
            if (len != 0 && CVar13 == CURLE_OK) {
              CVar13 = Curl_pp_sendf(pp,"%s");
              iVar8 = IMAP_AUTHENTICATE_FINAL;
              goto LAB_00446c6a;
            }
          }
          else {
            CVar13 = Curl_pp_sendf(pp,"%s","*");
            iVar8 = IMAP_AUTHENTICATE_CANCEL;
LAB_00446c6a:
            if (CVar13 == CURLE_OK) {
              (conn->proto).imapc.state = iVar8;
              CVar13 = CURLE_OK;
            }
          }
          pcVar19 = (char *)len;
          if (mech != (char *)0x0) {
            (*Curl_cfree)(mech);
            mech = (char *)0x0;
            pcVar19 = (char *)len;
          }
          goto LAB_00446cc8;
        }
LAB_004469ec:
        len = 0;
        mech = (char *)0x0;
        chlg64 = (char *)0x0;
        Curl_failf(pSVar18,"Access denied: %d",(ulong)(uint)imapcode);
LAB_00446cfb:
        CVar13 = CURLE_LOGIN_DENIED;
        break;
      case IMAP_AUTHENTICATE_DIGESTMD5:
        pSVar18 = conn->data;
        mech = (char *)0x0;
        chlg64 = (char *)0x0;
        len = 0;
        if (imapcode != 0x2b) goto LAB_004469ec;
        imap_get_message((pSVar18->state).buffer,&mech);
        CVar13 = Curl_sasl_create_digest_md5_message
                           (pSVar18,mech,conn->user,conn->passwd,"imap",&chlg64,&len);
        if (CVar13 == CURLE_OK) {
          CVar13 = Curl_pp_sendf(pp,"%s",chlg64);
          iVar8 = IMAP_AUTHENTICATE_DIGESTMD5_RESP;
        }
        else {
          pcVar19 = chlg64;
          if (CVar13 != CURLE_BAD_CONTENT_ENCODING) goto LAB_00446cc8;
          CVar13 = Curl_pp_sendf(pp,"%s","*");
          iVar8 = IMAP_AUTHENTICATE_CANCEL;
        }
        pcVar19 = chlg64;
        if (CVar13 == CURLE_OK) {
          (conn->proto).imapc.state = iVar8;
          CVar13 = CURLE_OK;
        }
LAB_00446cc8:
        if (pcVar19 == (char *)0x0) break;
        goto LAB_00446ccd;
      case IMAP_AUTHENTICATE_DIGESTMD5_RESP:
        if (imapcode != 0x2b) {
LAB_00446f15:
          pSVar18 = conn->data;
          pcVar19 = "Authentication failed: %d";
LAB_00446f1f:
          Curl_failf(pSVar18,pcVar19,(ulong)(uint)imapcode);
          return CURLE_LOGIN_DENIED;
        }
        CVar13 = Curl_pp_sendf(pp,"%s","");
        iVar8 = IMAP_AUTHENTICATE_FINAL;
LAB_0044656d:
        if (CVar13 != CURLE_OK) {
          return CVar13;
        }
        (conn->proto).imapc.state = iVar8;
        goto LAB_00446d3f;
      case IMAP_AUTHENTICATE_XOAUTH2:
        pSVar18 = conn->data;
        mech = (char *)0x0;
        chlg64 = (char *)0x0;
        if (imapcode != 0x2b) goto LAB_0044694e;
        CVar13 = Curl_sasl_create_xoauth2_message
                           (pSVar18,conn->user,conn->xoauth2_bearer,&chlg64,(size_t *)&mech);
LAB_00446902:
        if ((chlg64 != (char *)0x0 && CVar13 == CURLE_OK) &&
           (CVar13 = Curl_pp_sendf(pp,"%s"), CVar13 == CURLE_OK)) {
          (conn->proto).imapc.state = IMAP_AUTHENTICATE_FINAL;
LAB_00446946:
          CVar13 = CURLE_OK;
        }
LAB_00446acc:
        pcVar19 = chlg64;
        if (chlg64 != (char *)0x0) {
LAB_00446ccd:
          (*Curl_cfree)(pcVar19);
        }
        break;
      case IMAP_AUTHENTICATE_CANCEL:
        pSVar18 = conn->data;
        mech = (char *)0x0;
        chlg64 = (char *)0x0;
        len = 0;
        _state1 = _state1 & 0xffffffff00000000;
        local_4c = IMAP_STOP;
        puVar1 = &(conn->proto).imapc.authmechs;
        *puVar1 = *puVar1 ^ (conn->proto).imapc.authused;
        CVar13 = imap_calc_sasl_details(conn,&mech,&chlg64,&len,&state1,&local_4c);
        if (CVar13 == CURLE_OK) {
          if (mech != (char *)0x0) {
            CVar13 = imap_perform_authenticate(conn,mech,chlg64,state1,local_4c);
            pcVar19 = chlg64;
            goto LAB_00446cc8;
          }
          if (((conn->proto).ftpc.cwddone != false) ||
             ((*(byte *)((long)&conn->proto + 0x7c) & 1) == 0)) {
            pcVar19 = "Authentication cancelled";
            goto LAB_00446cf4;
          }
          CVar13 = imap_perform_login(conn);
        }
        break;
      case IMAP_AUTHENTICATE_FINAL:
        if (imapcode != 0x4f) goto LAB_00446f15;
        goto switchD_004463a4_caseD_4;
      case IMAP_LOGIN:
        if (imapcode != 0x4f) {
          pSVar18 = conn->data;
          pcVar19 = "Access denied. %c";
          goto LAB_00446f1f;
        }
        goto switchD_004463a4_caseD_4;
      case IMAP_LIST:
      case IMAP_SEARCH:
        if (imapcode != 0x2a) {
          if (imapcode != 0x4f) {
            return CURLE_QUOTE_ERROR;
          }
          goto switchD_004463a4_caseD_4;
        }
        pSVar18 = conn->data;
        pcVar19 = (pSVar18->state).buffer;
        local_58 = pp;
        sVar15 = strlen(pcVar19);
        (pSVar18->state).buffer[sVar15] = '\n';
        CVar13 = Curl_client_write(conn,1,pcVar19,sVar15 + 1);
        (pSVar18->state).buffer[sVar15] = '\0';
        pp = local_58;
        break;
      case IMAP_SELECT:
        pSVar18 = conn->data;
        if (imapcode == 0x4f) {
          pvVar5 = (pSVar18->req).protop;
          if (((*(char **)((long)pvVar5 + 0x10) == (char *)0x0) ||
              (pcVar19 = (conn->proto).imapc.mailbox_uidvalidity, pcVar19 == (char *)0x0)) ||
             (iVar14 = strcmp(*(char **)((long)pvVar5 + 0x10),pcVar19), iVar14 == 0)) {
            pcVar19 = (*Curl_cstrdup)(*(char **)((long)pvVar5 + 8));
            (conn->proto).ftpc.prevpath = pcVar19;
            if (*(long *)((long)pvVar5 + 0x38) == 0) {
              if (*(long *)((long)pvVar5 + 0x30) == 0) {
                CVar13 = imap_perform_fetch(conn);
              }
              else {
                CVar13 = imap_perform_search(conn);
              }
            }
            else {
              CVar13 = imap_perform_list(conn);
            }
          }
          else {
            Curl_failf(pSVar18,"Mailbox UIDVALIDITY has changed");
            CVar13 = CURLE_REMOTE_FILE_NOT_FOUND;
          }
        }
        else {
          if (imapcode != 0x2a) {
            pcVar19 = "Select failed";
LAB_00446cf4:
            Curl_failf(pSVar18,pcVar19);
            goto LAB_00446cfb;
          }
          iVar14 = __isoc99_sscanf((pSVar18->state).buffer + 2,"OK [UIDVALIDITY %19[0123456789]]",
                                   &mech);
          CVar13 = CURLE_OK;
          if (iVar14 == 1) {
            pcVar19 = (conn->proto).imapc.mailbox_uidvalidity;
            if (pcVar19 != (char *)0x0) {
              (*Curl_cfree)(pcVar19);
              (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
            }
            pcVar19 = (*Curl_cstrdup)((char *)&mech);
            (conn->proto).imapc.mailbox_uidvalidity = pcVar19;
            CVar13 = CURLE_OK;
          }
        }
        break;
      case IMAP_FETCH:
        pSVar18 = conn->data;
        if (imapcode == 0x2a) {
          pcVar19 = (pSVar18->state).buffer;
          __nptr = (pSVar18->state).buffer;
          while( true ) {
            __nptr = __nptr + 1;
            if (__nptr[-1] == '\0') break;
            if (__nptr[-1] == '{') {
              size = (pingpong *)strtol(__nptr,&mech,10);
              if ((((1 < (long)mech - (long)pcVar19) && (*mech == '}')) && (mech[1] == '\r')) &&
                 (mech[2] == '\0')) {
                Curl_infof(pSVar18,"Found %lu bytes to download\n",size);
                Curl_pgrsSetDownloadSize(pSVar18,(curl_off_t)size);
                if (pp->cache != (char *)0x0) {
                  local_58 = (pingpong *)(conn->proto).ftpc.pp.cache_size;
                  if (size <= local_58) {
                    local_58 = size;
                  }
                  CVar13 = Curl_client_write(conn,1,pp->cache,(size_t)local_58);
                  ppVar10 = local_58;
                  if (CVar13 != CURLE_OK) {
                    return CVar13;
                  }
                  pcVar3 = &(pSVar18->req).bytecount;
                  *pcVar3 = (long)&local_58->cache + *pcVar3;
                  Curl_infof(pSVar18,"Written %lu bytes, %lu bytes are left for transfer\n",local_58
                            );
                  ppVar11 = local_58;
                  pvVar5 = (conn->proto).generic;
                  ppVar6 = (pingpong *)(conn->proto).ftpc.pp.cache_size;
                  sVar15 = (long)ppVar6 - (long)ppVar10;
                  if (ppVar6 < ppVar10 || sVar15 == 0) {
                    if (pvVar5 != (void *)0x0) {
                      (*Curl_cfree)(pvVar5);
                      pp->cache = (char *)0x0;
                    }
                    sVar17 = 0;
                  }
                  else {
                    memmove(pvVar5,(void *)((long)pvVar5 + (long)local_58),sVar15);
                    sVar17 = (conn->proto).ftpc.pp.cache_size - (long)ppVar11;
                  }
                  (conn->proto).ftpc.pp.cache_size = sVar17;
                }
                if ((pingpong *)(pSVar18->req).bytecount == size) {
                  iVar14 = -1;
                  size = (pingpong *)0xffffffffffffffff;
                }
                else {
                  (pSVar18->req).maxdownload = (curl_off_t)size;
                  iVar14 = 0;
                }
                CVar13 = CURLE_OK;
                Curl_setup_transfer(conn,iVar14,(curl_off_t)size,false,(curl_off_t *)0x0,-1,
                                    (curl_off_t *)0x0);
                goto LAB_00446c0b;
              }
              break;
            }
            pcVar19 = pcVar19 + 1;
          }
          Curl_failf(((conn->proto).ftpc.pp.conn)->data,"Failed to parse FETCH response.");
          CVar13 = CURLE_FTP_WEIRD_SERVER_REPLY;
        }
        else {
          Curl_pgrsSetDownloadSize(pSVar18,-1);
          CVar13 = CURLE_REMOTE_FILE_NOT_FOUND;
        }
LAB_00446c0b:
        (conn->proto).imapc.state = IMAP_STOP;
        break;
      case IMAP_FETCH_FINAL:
        if (imapcode != 0x4f) {
          return CURLE_FTP_WEIRD_SERVER_REPLY;
        }
        goto switchD_004463a4_caseD_4;
      case IMAP_APPEND:
        if (imapcode != 0x2b) {
          return CURLE_UPLOAD_FAILED;
        }
        Curl_pgrsSetUploadSize(conn->data,(conn->data->state).infilesize);
        Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,0,(curl_off_t *)0x0);
        (conn->proto).imapc.state = IMAP_STOP;
        return CURLE_OK;
      case IMAP_APPEND_FINAL:
        if (imapcode != 0x4f) {
          return CURLE_UPLOAD_FAILED;
        }
switchD_004463a4_caseD_4:
        (conn->proto).imapc.state = IMAP_STOP;
        goto LAB_00446f0d;
      }
      if (CVar13 != CURLE_OK) {
        return CVar13;
      }
      if ((conn->proto).imapc.state == IMAP_STOP) break;
LAB_00446d3f:
      _Var12 = Curl_pp_moredata(pp);
    } while (_Var12);
LAB_00446f0d:
    CVar13 = CURLE_OK;
  }
  return CVar13;
}

Assistant:

static CURLcode imap_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
  if(imapc->state == IMAP_UPGRADETLS)
    return imap_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_FTP_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_PLAIN:
      result = imap_state_auth_plain_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_LOGIN:
      result = imap_state_auth_login_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_LOGIN_PASSWD:
      result = imap_state_auth_login_password_resp(conn, imapcode,
                                                   imapc->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case IMAP_AUTHENTICATE_CRAMMD5:
      result = imap_state_auth_cram_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_DIGESTMD5:
      result = imap_state_auth_digest_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_DIGESTMD5_RESP:
      result = imap_state_auth_digest_resp_resp(conn, imapcode, imapc->state);
      break;
#endif

#ifdef USE_NTLM
    case IMAP_AUTHENTICATE_NTLM:
      result = imap_state_auth_ntlm_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_NTLM_TYPE2MSG:
      result = imap_state_auth_ntlm_type2msg_resp(conn, imapcode,
                                                  imapc->state);
      break;
#endif

#if defined(USE_WINDOWS_SSPI)
    case IMAP_AUTHENTICATE_GSSAPI:
      result = imap_state_auth_gssapi_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_GSSAPI_TOKEN:
      result = imap_state_auth_gssapi_token_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_GSSAPI_NO_DATA:
      result = imap_state_auth_gssapi_no_data_resp(conn, imapcode,
                                                   imapc->state);
      break;
#endif

    case IMAP_AUTHENTICATE_XOAUTH2:
      result = imap_state_auth_xoauth2_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_CANCEL:
      result = imap_state_auth_cancel_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE_FINAL:
      result = imap_state_auth_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LIST:
      result = imap_state_list_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SEARCH:
      result = imap_state_search_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}